

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CMakeLibTests.cxx
# Opt level: O3

int main(int ac,char **av)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  clock_t cVar4;
  clock_t cVar5;
  functionMapEntry *pfVar6;
  char *pcVar7;
  ulong uVar8;
  long lVar9;
  uint uVar10;
  bool bVar11;
  bool bVar12;
  int testNum;
  char **local_48;
  uint local_38;
  uint local_34;
  
  local_38 = 0;
  uVar10 = 0xffffffff;
  local_48 = av;
  if (ac < 2) {
    puts("Available tests:");
    pfVar6 = cmakeGeneratedFunctionMapEntries;
    uVar8 = 0;
    do {
      printf("%3d. %s\n",uVar8 & 0xffffffff,pfVar6->name);
      uVar8 = uVar8 + 1;
      pfVar6 = pfVar6 + 1;
    } while (uVar8 != 6);
    printf("To run a test, enter the test number: ");
    fflush(_stdout);
    iVar1 = __isoc99_scanf("%d",&local_38);
    if (iVar1 != 1) {
      pcVar7 = "Couldn\'t parse that input as a number";
      goto LAB_0012ab0c;
    }
    if (5 < (int)local_38) {
      pcVar7 = "%3d is an invalid test number.\n";
      goto LAB_0012ac59;
    }
    ac = ac - 1;
    local_48 = av + 1;
    uVar10 = local_38;
  }
  if (ac < 2 || uVar10 != 0xffffffff) {
    if (uVar10 == 0xffffffff) {
      bVar12 = false;
      local_34 = 0;
      goto LAB_0012abaa;
    }
  }
  else {
    pcVar7 = local_48[1];
    bVar12 = false;
    local_34 = 0;
    if (*pcVar7 == '-') {
      local_34 = 0;
      bVar12 = false;
      if (pcVar7[1] == 'R') {
        bVar12 = pcVar7[2] == '\0';
        if (bVar12 && (uint)ac < 3) {
          pcVar7 = "-R needs an additional parameter.";
LAB_0012ab0c:
          puts(pcVar7);
          return -1;
        }
        local_34 = (uint)(pcVar7[2] == '\0');
      }
      if ((pcVar7[1] == 'A') && (pcVar7[2] == '\0')) {
        puts("TAP version 13");
        printf("1..%d\n",6);
        lVar9 = 0;
        do {
          pcVar7 = cmakeGeneratedFunctionMapEntries[lVar9].name;
          if (2 < (uint)ac) {
            uVar8 = 0;
            do {
              iVar1 = strcmp(pcVar7,local_48[uVar8 + 2]);
              if (iVar1 == 0) {
                printf("ok %d %s # SKIP\n",lVar9 + 1U & 0xffffffff,pcVar7);
                goto LAB_0012adbe;
              }
              uVar8 = uVar8 + 1;
            } while (ac - 2 != uVar8);
          }
          cVar4 = clock();
          iVar1 = (*cmakeGeneratedFunctionMapEntries[lVar9].func)(ac,local_48);
          cVar5 = clock();
          pcVar2 = "ok";
          if (iVar1 == -1) {
            pcVar2 = "not ok";
          }
          printf("%s %d %s # %f\n",(double)(cVar5 - cVar4) / 1000000.0,pcVar2,
                 lVar9 + 1U & 0xffffffff,pcVar7);
LAB_0012adbe:
          lVar9 = lVar9 + 1;
          if (lVar9 == 6) {
            puts("All tests finished.");
            return 0;
          }
        } while( true );
      }
    }
LAB_0012abaa:
    pcVar7 = lowercase(local_48[(ulong)local_34 + 1]);
    pfVar6 = cmakeGeneratedFunctionMapEntries;
    uVar8 = 0;
    do {
      pcVar2 = lowercase(pfVar6->name);
      if ((bVar12) && (pcVar3 = strstr(pcVar2,pcVar7), pcVar3 != (char *)0x0)) {
        ac = ac - 2;
        local_48 = local_48 + 2;
LAB_0012ac1b:
        uVar10 = (uint)uVar8;
      }
      else {
        uVar10 = 0xffffffff;
        if ((local_34 == 0) && (iVar1 = strcmp(pcVar2,pcVar7), iVar1 == 0)) {
          ac = ac - 1;
          local_48 = local_48 + 1;
          goto LAB_0012ac1b;
        }
      }
      free(pcVar2);
      if (uVar10 != 0xffffffff) break;
      pfVar6 = pfVar6 + 1;
      bVar11 = uVar8 < 5;
      uVar8 = uVar8 + 1;
    } while (bVar11);
    free(pcVar7);
    if (uVar10 == 0xffffffff) {
      puts("Available tests:");
      pfVar6 = cmakeGeneratedFunctionMapEntries;
      uVar8 = 0;
      do {
        printf("%3d. %s\n",uVar8 & 0xffffffff,pfVar6->name);
        uVar8 = uVar8 + 1;
        pfVar6 = pfVar6 + 1;
      } while (uVar8 != 6);
      printf("Failed: %s is an invalid test name.\n",local_48[1]);
      return -1;
    }
  }
  if (uVar10 < 6) {
    iVar1 = (*cmakeGeneratedFunctionMapEntries[uVar10].func)(ac,local_48);
    return iVar1;
  }
  pcVar7 = "testToRun was modified by TestDriver code to an invalid value: %3d.\n";
LAB_0012ac59:
  printf(pcVar7,(ulong)local_38);
  return -1;
}

Assistant:

int main(int ac, char* av[])
{
  int i;
  int testNum = 0;
  int partial_match;
  int run_all;
  char *arg;
  int testToRun = -1;

  

  /* If no test name was given */
  /* process command line with user function.  */
  if (ac < 2) {
    /* Ask for a test.  */
    printf("Available tests:\n");
    for (i = 0; i < NumTests; ++i) {
      printf("%3d. %s\n", i, cmakeGeneratedFunctionMapEntries[i].name);
    }
    printf("To run a test, enter the test number: ");
    fflush(stdout);
    if (scanf("%d", &testNum) != 1) {
      printf("Couldn't parse that input as a number\n");
      return -1;
    }
    if (testNum >= NumTests) {
      printf("%3d is an invalid test number.\n", testNum);
      return -1;
    }
    testToRun = testNum;
    ac--;
    av++;
  }
  partial_match = 0;
  run_all = 0;
  arg = CM_NULL; /* NOLINT */
  /* If partial match or running all tests are requested.  */
  if (testToRun == -1 && ac > 1) {
    partial_match = (strcmp(av[1], "-R") == 0) ? 1 : 0;
    run_all = (strcmp(av[1], "-A") == 0) ? 1 : 0;
  }
  if (partial_match != 0 && ac < 3) {
    printf("-R needs an additional parameter.\n");
    return -1;
  }
  if (run_all == 1) {
    clock_t t;
    int status = 0;
    const char* status_message = CM_NULL;
    printf("TAP version 13\n");
    printf("1..%d\n", NumTests);
    for (i = 0; i < NumTests; ++i) {
      const char *name = cmakeGeneratedFunctionMapEntries[i].name;
      if (ac > 2) {
        if (isTestSkipped(name, ac - 2, av + 2) == 1) {
          printf("ok %d %s # SKIP\n", i + 1, name);
          continue;
        }
      }
      t = clock();
      status = (*cmakeGeneratedFunctionMapEntries[i].func)(ac, av);
      t = clock() - t;
      status_message = (status == -1) ? "not ok" : "ok";
      {
        double time_taken = CM_CAST(double, t) / CLOCKS_PER_SEC;
        printf("%s %d %s # %f\n", status_message, i + 1, name, time_taken);
      }
    }
    printf("All tests finished.\n");

    return 0;
  }

  if (testToRun == -1) {
    arg = lowercase(av[1 + partial_match]);
  }
  for (i = 0; i < NumTests && testToRun == -1; ++i) {
    char *test_name = lowercase(cmakeGeneratedFunctionMapEntries[i].name);
    if (partial_match != 0 && strstr(test_name, arg) != CM_NULL) { /* NOLINT */
      testToRun = i;
      ac -= 2;
      av += 2;
    } else if (partial_match == 0 && strcmp(test_name, arg) == 0) {
      testToRun = i;
      ac--;
      av++;
    }
    free(test_name);
  }
  free(arg);
  if (testToRun != -1) {
    int result;

    if (testToRun < 0 || testToRun >= NumTests) {
      printf("testToRun was modified by TestDriver code to an invalid value: "
             "%3d.\n",
             testNum);
      return -1;
    }
    result = (*cmakeGeneratedFunctionMapEntries[testToRun].func)(ac, av);

    return result;
  }

  /* Nothing was run, display the test names.  */
  printf("Available tests:\n");
  for (i = 0; i < NumTests; ++i) {
    printf("%3d. %s\n", i, cmakeGeneratedFunctionMapEntries[i].name);
  }
  printf("Failed: %s is an invalid test name.\n", av[1]);

  return -1;
}